

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::mipmapped_texture::read_dds_internal
          (mipmapped_texture *this,data_stream_serializer *serializer)

{
  dynamic_string *this_00;
  element *peVar1;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  component_flags cVar6;
  uint uVar7;
  uint uVar8;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar9;
  byte *pbVar10;
  undefined8 extraout_RAX;
  dxt_image *this_01;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  undefined8 extraout_RAX_00;
  undefined8 uVar11;
  undefined8 extraout_RAX_01;
  byte bVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 uVar18;
  uint uVar19;
  vector<crnlib::mip_level_*> *this_02;
  char *pcVar20;
  pixel_format pVar21;
  uint uVar22;
  color_quad<unsigned_char,_int> *pcVar23;
  ulong uVar24;
  uint i;
  long lVar25;
  uint uVar26;
  vector<unsigned_char> load_buf;
  uint8 hdr [4];
  uint mask_size [4];
  uint mask_ofs [4];
  DDSURFACEDESC2 desc;
  uint local_174;
  undefined1 local_170 [2];
  undefined1 auStack_16e [6];
  undefined4 local_168;
  uint local_164;
  uint local_160;
  int local_15c;
  uchar *local_158;
  undefined8 uStack_150;
  mipmapped_texture *local_148;
  ulong local_140;
  ulong local_138;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_130;
  data_stream_serializer *local_128;
  uint local_120;
  int local_11c;
  uint local_118 [4];
  face_vec *local_108;
  mip_level *local_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  dynamic_string *local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  long local_c0;
  ulong local_b8;
  int local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_94;
  uint local_60;
  int local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  byte local_44;
  byte local_42;
  uint local_40;
  
  clear(this);
  this_00 = &this->m_last_error;
  dynamic_string::set(this_00,"Not a DDS file",0xffffffff);
  iVar4 = (*serializer->m_pStream->_vptr_data_stream[4])(serializer->m_pStream,&local_11c,4);
  if ((iVar4 == 4) && (local_11c == 0x20534444)) {
    iVar4 = (*serializer->m_pStream->_vptr_data_stream[4])(serializer->m_pStream,&local_ac,0x7c);
    bVar12 = 0;
    if ((iVar4 != 0x7c) || (local_ac != 0x7c)) goto LAB_0012e7b1;
    if (0xffffdfff < local_a0 - 0x2001 && 0xffffdfff < local_a4 - 0x2001) {
      this->m_width = local_a0;
      this->m_height = local_a4;
      uVar19 = 1;
      uVar7 = 1;
      if ((((local_a8 & 0x20000) == 0) || ((local_94 != 0 & local_42 >> 6) != 1)) ||
         (uVar5 = utils::compute_max_mips(local_a0,local_a4), uVar7 = local_94, local_94 <= uVar5))
      {
        if ((local_44 & 8) == 0) {
LAB_0012e86e:
          if ((local_60 & 0x20) == 0) {
            if ((local_60 & 4) == 0) {
              if (0x18 < local_58 - 8 || (local_58 & 7) != 0) {
                pcVar20 = "Unsupported bit count";
                goto LAB_0012ed26;
              }
              if ((local_60 & 0x40) == 0) {
                if ((local_60 & 1) == 0) {
                  if ((local_60 >> 0x11 & 1) != 0) goto LAB_0012eab6;
                  if ((local_60 & 2) == 0) {
                    pcVar20 = "Unsupported format";
                    goto LAB_0012ed26;
                  }
                }
                else if ((local_60 >> 0x11 & 1) != 0) {
LAB_0012ead0:
                  this->m_format = PIXEL_FMT_A8L8;
                  local_174 = 0xffffffff;
                  pVar21 = PIXEL_FMT_A8L8;
                  goto LAB_0012ec7e;
                }
                this->m_format = PIXEL_FMT_A8;
                local_174 = 0xffffffff;
                pVar21 = PIXEL_FMT_A8;
              }
              else {
                if ((local_60 >> 0x11 & 1) == 0) {
                  if ((local_60 & 1) == 0) {
                    this->m_format = PIXEL_FMT_R8G8B8;
                    local_174 = 0xffffffff;
                    pVar21 = PIXEL_FMT_R8G8B8;
                  }
                  else {
                    this->m_format = PIXEL_FMT_A8R8G8B8;
                    local_174 = 0xffffffff;
                    pVar21 = PIXEL_FMT_A8R8G8B8;
                  }
                  goto LAB_0012ec7e;
                }
                if ((local_60 & 1) != 0) goto LAB_0012ead0;
LAB_0012eab6:
                this->m_format = PIXEL_FMT_L8;
                local_174 = 0xffffffff;
                pVar21 = PIXEL_FMT_L8;
              }
            }
            else if (local_5c < 0x33545844) {
              if (local_5c < 0x32435445) {
                if (local_5c == 0x31435445) {
                  this->m_format = PIXEL_FMT_ETC1;
                  local_174 = 7;
                  pVar21 = PIXEL_FMT_ETC1;
                }
                else if (local_5c == 0x31495441) {
                  this->m_format = PIXEL_FMT_DXT5A;
                  local_174 = 4;
                  pVar21 = PIXEL_FMT_DXT5A;
                }
                else {
                  if (local_5c != 0x31545844) goto LAB_0012ebc7;
                  this->m_format = PIXEL_FMT_DXT1;
                  local_174 = 0;
                  pVar21 = PIXEL_FMT_DXT1;
                }
              }
              else if (local_5c == 0x32435445) {
                this->m_format = PIXEL_FMT_ETC2;
                local_174 = 8;
                pVar21 = PIXEL_FMT_ETC2;
              }
              else {
                if (local_5c != 0x32495441) {
                  if (local_5c == 0x32545844) goto LAB_0012ea3a;
LAB_0012ebc7:
                  dynamic_string::dynamic_string
                            ((dynamic_string *)&local_158,cVarArg,
                             "Unsupported DDS FOURCC format: 0x%08X");
                  pcVar20 = "";
                  if (uStack_150 != (char *)0x0) {
                    pcVar20 = uStack_150;
                  }
                  dynamic_string::set(this_00,pcVar20,0xffffffff);
                  dynamic_string::~dynamic_string((dynamic_string *)&local_158);
                  goto LAB_0012e7af;
                }
                if (local_58 == 0x59583241) {
                  this->m_format = PIXEL_FMT_DXN;
                  local_174 = 5;
                  pVar21 = PIXEL_FMT_DXN;
                }
                else {
                  this->m_format = PIXEL_FMT_3DC;
                  local_174 = 6;
                  pVar21 = PIXEL_FMT_3DC;
                }
              }
            }
            else if (local_5c < 0x41325445) {
              if (local_5c == 0x33545844) {
LAB_0012ea3a:
                this->m_format = PIXEL_FMT_DXT3;
                local_174 = 2;
                pVar21 = PIXEL_FMT_DXT3;
              }
              else {
                if ((local_5c != 0x34545844) && (local_5c != 0x35545844)) goto LAB_0012ebc7;
                if ((int)local_58 < 0x52784778) {
                  if (local_58 == 0x52424741) {
                    this->m_format = PIXEL_FMT_DXT5_AGBR;
                    local_174 = 3;
                    pVar21 = PIXEL_FMT_DXT5_AGBR;
                  }
                  else if (local_58 == 0x52424778) {
                    this->m_format = PIXEL_FMT_DXT5_xGBR;
                    local_174 = 3;
                    pVar21 = PIXEL_FMT_DXT5_xGBR;
                  }
                  else {
LAB_0012ec3b:
                    this->m_format = PIXEL_FMT_DXT5;
                    local_174 = 3;
                    pVar21 = PIXEL_FMT_DXT5;
                  }
                }
                else if (local_58 == 0x52784778) {
                  this->m_format = PIXEL_FMT_DXT5_xGxR;
                  local_174 = 3;
                  pVar21 = PIXEL_FMT_DXT5_xGxR;
                }
                else {
                  if (local_58 != 0x59784343) goto LAB_0012ec3b;
                  this->m_format = PIXEL_FMT_DXT5_CCxY;
                  local_174 = 3;
                  pVar21 = PIXEL_FMT_DXT5_CCxY;
                }
              }
            }
            else if (local_5c == 0x41325445) {
              this->m_format = PIXEL_FMT_ETC2A;
              local_174 = 9;
              pVar21 = PIXEL_FMT_ETC2A;
            }
            else if (local_5c == 0x53315445) {
              this->m_format = PIXEL_FMT_ETC1S;
              local_174 = 10;
              pVar21 = PIXEL_FMT_ETC1S;
            }
            else {
              if (local_5c != 0x53413245) goto LAB_0012ebc7;
              this->m_format = PIXEL_FMT_ETC2AS;
              local_174 = 0xb;
              pVar21 = PIXEL_FMT_ETC2AS;
            }
LAB_0012ec7e:
            cVar6 = pixel_format_helpers::get_component_flags(pVar21);
            this->m_comp_flags = cVar6;
            uVar5 = local_58;
            if ((local_60 & 4) != 0) {
              uVar5 = pixel_format_helpers::get_bpp(this->m_format);
            }
            dynamic_string::set(this_00,"Load failed",0xffffffff);
            uVar15 = local_a0;
            if ((local_60 & 4) != 0) {
              uVar15 = (local_a0 + 3 & 0xfffffffc) * (local_a4 + 3 & 0x3ffffffc);
            }
            if (local_9c == 0 || (local_a8 & 0x80008) != 8) {
              local_164 = uVar15 * uVar5 >> 3;
            }
            else {
              local_164 = local_9c;
              if ((uVar15 * uVar5 & 0xfffffff8) < local_9c) {
                pcVar20 = "Invalid pitch";
                goto LAB_0012ed26;
              }
            }
            local_158 = (uchar *)0x0;
            uStack_150 = (char *)0x0;
            local_118[1] = 0;
            local_118[0] = 0;
            if (local_54 != 0) {
              local_118[0] = 0;
              uVar22 = local_54;
              do {
                local_118[0] = local_118[0] + 1;
                uVar22 = uVar22 - 1 & uVar22;
              } while (uVar22 != 0);
            }
            if (local_50 != 0) {
              local_118[1] = 0;
              uVar22 = local_50;
              do {
                local_118[1] = local_118[1] + 1;
                uVar22 = uVar22 - 1 & uVar22;
              } while (uVar22 != 0);
            }
            local_118[3] = 0;
            local_118[2] = 0;
            if (local_4c != 0) {
              local_118[2] = 0;
              uVar22 = local_4c;
              do {
                local_118[2] = local_118[2] + 1;
                uVar22 = uVar22 - 1 & uVar22;
              } while (uVar22 != 0);
            }
            if (local_48 != 0) {
              local_118[3] = 0;
              uVar22 = local_48;
              do {
                local_118[3] = local_118[3] + 1;
                uVar22 = uVar22 - 1 & uVar22;
              } while (uVar22 != 0);
            }
            local_f4 = 0;
            local_f8 = 0;
            if ((local_54 & 1) == 0 && local_54 != 0) {
              local_f8 = 0;
              do {
                local_f8 = local_f8 + 1;
                uVar22 = local_54 & 2;
                local_54 = local_54 >> 1;
              } while (uVar22 == 0);
            }
            if ((local_50 & 1) == 0 && local_50 != 0) {
              local_f4 = 0;
              do {
                local_f4 = local_f4 + 1;
                uVar22 = local_50 & 2;
                local_50 = local_50 >> 1;
              } while (uVar22 == 0);
            }
            local_ec = 0;
            local_f0 = 0;
            if ((local_4c & 1) == 0 && local_4c != 0) {
              local_f0 = 0;
              uVar24 = (ulong)local_4c;
              do {
                uVar24 = uVar24 >> 1;
                local_f0 = local_f0 + 1;
                uVar22 = local_4c & 2;
                local_4c = (uint)uVar24;
              } while (uVar22 == 0);
            }
            if ((local_48 & 1) == 0 && local_48 != 0) {
              local_ec = 0;
              do {
                local_ec = local_ec + 1;
                uVar22 = local_48 & 2;
                local_48 = local_48 >> 1;
              } while (uVar22 == 0);
            }
            if ((local_118[0] == 0 && (local_60 >> 0x11 & 1) != 0) &&
               (local_118[0] = local_58 >> 3, (local_60 & 1) != 0)) {
              local_118[0] = local_58 >> 4;
            }
            local_108 = &this->m_faces;
            auStack_16e._2_4_ = uVar7;
            local_148 = this;
            local_128 = serializer;
            local_e0 = this_00;
            vector<crnlib::vector<crnlib::mip_level_*>_>::resize(local_108,uVar19,false);
            local_d8 = (ulong)uVar19;
            local_c8 = (ulong)(uint)auStack_16e._2_4_;
            uVar24 = 0;
            local_168 = 0;
            local_138 = 0;
            do {
              local_c0 = uVar24 * 0x10;
              uVar7 = local_108->m_p[uVar24].m_size;
              this_02 = local_108->m_p + uVar24;
              local_d0 = uVar24;
              if (uVar7 != auStack_16e._2_4_) {
                if (uVar7 <= (uint)auStack_16e._2_4_) {
                  if (this_02->m_capacity < (uint)auStack_16e._2_4_) {
                    elemental_vector::increase_capacity
                              ((elemental_vector *)this_02,auStack_16e._2_4_,
                               uVar7 + 1 == auStack_16e._2_4_,8,(object_mover)0x0,false);
                    uVar7 = this_02->m_size;
                  }
                  memset(this_02->m_p + uVar7,0,(ulong)(auStack_16e._2_4_ - uVar7) << 3);
                }
                this_02->m_size = auStack_16e._2_4_;
              }
              uVar24 = 0;
              do {
                uVar19 = local_a0 >> ((byte)uVar24 & 0x1f);
                uVar19 = uVar19 + (uVar19 == 0);
                uVar7 = local_a4 >> ((byte)uVar24 & 0x1f);
                local_140 = (ulong)(uVar7 + (uVar7 == 0));
                local_100 = (mip_level *)crnlib_malloc(0x28);
                local_100->m_width = 0;
                local_100->m_height = 0;
                local_100->m_comp_flags = cDefaultCompFlags;
                *(undefined8 *)&local_100->m_format = 0;
                *(undefined8 *)((long)&local_100->m_pImage + 4) = 0;
                *(undefined8 *)((long)&local_100->m_pDXTImage + 4) = 0;
                *(mip_level **)(*(long *)((long)&local_108->m_p->m_p + local_c0) + uVar24 * 8) =
                     local_100;
                local_b8 = uVar24;
                if ((local_60 & 4) != 0) {
                  pVar21 = local_148->m_format;
                  iVar4 = 8;
                  if (0x41315843 < (int)pVar21) {
                    if ((int)pVar21 < 0x52784778) {
                      if ((int)pVar21 < 0x52424741) {
                        if (pVar21 == PIXEL_FMT_DXT1A) goto LAB_0012f33f;
                        if (pVar21 == PIXEL_FMT_ETC2A) goto LAB_0012f33a;
                      }
                      else if ((pVar21 == PIXEL_FMT_DXT5_AGBR) || (pVar21 == PIXEL_FMT_DXT5_xGBR))
                      goto LAB_0012f33a;
                    }
                    else if ((int)pVar21 < 0x53413245) {
                      if (pVar21 == PIXEL_FMT_DXT5_xGxR) goto LAB_0012f33a;
                      if (pVar21 == PIXEL_FMT_ETC1S) goto LAB_0012f33f;
                    }
                    else if (((pVar21 == PIXEL_FMT_ETC2AS) || (pVar21 == PIXEL_FMT_DXN)) ||
                            (pVar21 == PIXEL_FMT_DXT5_CCxY)) goto LAB_0012f33a;
                    goto LAB_0012f336;
                  }
                  if ((int)pVar21 < 0x32495441) {
                    if ((int)pVar21 < 0x31545844) {
                      if ((pVar21 != PIXEL_FMT_ETC1) && (pVar21 != PIXEL_FMT_DXT5A))
                      goto LAB_0012f336;
                    }
                    else if ((pVar21 != PIXEL_FMT_DXT1) && (pVar21 != PIXEL_FMT_ETC2))
                    goto LAB_0012f336;
                  }
                  else {
                    if ((int)pVar21 < 0x33545844) {
                      if ((pVar21 == PIXEL_FMT_3DC) || (pVar21 == PIXEL_FMT_DXT2))
                      goto LAB_0012f33a;
                    }
                    else if ((pVar21 == PIXEL_FMT_DXT3) ||
                            ((pVar21 == PIXEL_FMT_DXT4 || (pVar21 == PIXEL_FMT_DXT5)))) {
LAB_0012f33a:
                      iVar4 = 0x10;
                      goto LAB_0012f33f;
                    }
LAB_0012f336:
                    iVar4 = 0;
                  }
LAB_0012f33f:
                  uVar19 = ((int)local_140 + 3U >> 2) * (uVar19 + 3 >> 2) * iVar4;
                  uVar7 = uVar19;
                  if (uVar24 == 0) {
                    uVar7 = local_164;
                  }
                  this_01 = (dxt_image *)crnlib_malloc(0x48);
                  dxt_image::dxt_image(this_01);
                  iVar4 = dxt_image::init(this_01,(EVP_PKEY_CTX *)(ulong)local_174);
                  peVar1 = (this_01->m_elements).m_p;
                  if ((char)iVar4 == '\0') {
                    if (peVar1 != (element *)0x0) {
                      crnlib_free(peVar1);
                    }
                  }
                  else {
                    uVar22 = (*local_128->m_pStream->_vptr_data_stream[4])
                                       (local_128->m_pStream,peVar1,(ulong)uVar19);
                    if (uVar22 == uVar19) {
                      uVar22 = uVar7 - uVar19;
                      if ((uVar7 < uVar19 || uVar22 == 0) ||
                         (iVar4 = (*local_128->m_pStream->_vptr_data_stream[5])
                                            (local_128->m_pStream,(ulong)uVar22),
                         CONCAT44(extraout_var_00,iVar4) == (ulong)uVar22)) {
                        pVar21 = local_148->m_format;
                        if ((pVar21 == PIXEL_FMT_DXT1) &&
                           (pVar21 = PIXEL_FMT_DXT1, (local_138 & 1) == 0)) {
                          bVar3 = dxt_image::has_alpha(this_01);
                          local_138 = CONCAT71(extraout_var,bVar3);
                          pVar21 = local_148->m_format;
                        }
                        mip_level::assign(local_100,this_01,pVar21,cDefaultOrientationFlags);
                        uVar11 = extraout_RAX_00;
                        goto LAB_0012f414;
                      }
                      peVar1 = (this_01->m_elements).m_p;
                      if (peVar1 != (element *)0x0) {
                        crnlib_free(peVar1);
                      }
                    }
                    else {
                      peVar1 = (this_01->m_elements).m_p;
                      if (peVar1 != (element *)0x0) {
                        crnlib_free(peVar1);
                      }
                    }
                  }
                  crnlib_free(this_01);
                  goto LAB_0012f492;
                }
                piVar9 = (image<crnlib::color_quad<unsigned_char,_int>_> *)crnlib_malloc(0x30);
                _local_170 = 0xff000000;
                image<crnlib::color_quad<unsigned_char,_int>_>::image
                          (piVar9,uVar19,(uint)local_140,0xffffffff,
                           (color_quad<unsigned_char,_int> *)local_170,0xf);
                uVar7 = local_58;
                piVar9->m_comp_flags = local_148->m_comp_flags;
                uVar22 = local_58 >> 3;
                local_160 = uVar22 * uVar19;
                if (uVar24 == 0) {
                  local_160 = local_164;
                }
                local_130 = piVar9;
                if ((uint)uStack_150 < local_160) {
                  if (uStack_150._4_4_ < local_160) {
                    elemental_vector::increase_capacity
                              ((elemental_vector *)&local_158,local_160,
                               (uint)uStack_150 + 1 == local_160,1,(object_mover)0x0,false);
                  }
                  memset(local_158 + (uint)uStack_150,0,(ulong)(local_160 - (uint)uStack_150));
                  uStack_150 = (char *)CONCAT44(uStack_150._4_4_,local_160);
                }
                _local_170 = 0xff000000;
                local_15c = 0;
                local_120 = uVar7;
                do {
                  uVar7 = local_160;
                  uVar8 = (*local_128->m_pStream->_vptr_data_stream[4])
                                    (local_128->m_pStream,local_158,(ulong)local_160);
                  piVar9 = local_130;
                  if (uVar8 != uVar7) {
                    pcVar23 = (local_130->m_pixel_buf).m_p;
                    if (pcVar23 != (color_quad<unsigned_char,_int> *)0x0) {
                      crnlib_free(pcVar23);
                    }
                    crnlib_free(piVar9);
                    goto LAB_0012f492;
                  }
                  pcVar23 = local_130->m_pPixels + local_130->m_pitch * local_15c;
                  uVar7 = 0;
                  uVar24 = 0;
                  do {
                    uVar8 = 0;
                    if (7 < local_120) {
                      pbVar10 = local_158 + uVar7;
                      uVar16 = 0;
                      uVar8 = 0;
                      do {
                        uVar8 = uVar8 | (uint)*pbVar10 << ((byte)uVar16 & 0x1f);
                        uVar16 = uVar16 + 8;
                        pbVar10 = pbVar10 + 1;
                      } while (uVar22 * 8 != uVar16);
                    }
                    lVar25 = 0;
                    do {
                      if (local_118[lVar25] != 0) {
                        uVar26 = ~(-1 << ((byte)local_118[lVar25] & 0x1f));
                        uVar16 = (ulong)((uVar26 >> 1) +
                                        (uVar8 >> (*(byte *)(&local_f8 + lVar25) & 0x1f) & uVar26) *
                                        0xff) / (ulong)uVar26;
                        uVar26 = (uint)uVar16;
                        uVar17 = 0xff;
                        if (uVar26 < 0xff) {
                          uVar17 = uVar16;
                        }
                        uVar13 = (char)uVar17;
                        if ((int)uVar26 < 0) {
                          uVar13 = 0;
                        }
                        local_170[lVar25] = uVar13;
                      }
                      aVar2 = _local_170;
                      lVar25 = lVar25 + 1;
                    } while (lVar25 != 4);
                    uVar13 = local_170[0];
                    if ((local_60 & 0x20000) == 0) {
                      uVar18 = local_170[1];
                      uVar14 = auStack_16e[0];
                    }
                    else {
                      local_170[1] = local_170[0];
                      auStack_16e[1] = aVar2.field_0.a;
                      auStack_16e[0] = local_170[0];
                      uVar18 = local_170[0];
                      uVar14 = local_170[0];
                    }
                    (pcVar23->field_0).field_0.r = uVar13;
                    (pcVar23->field_0).field_0.g = uVar18;
                    (pcVar23->field_0).field_0.b = uVar14;
                    (pcVar23->field_0).field_0.a = auStack_16e[1];
                    pcVar23 = pcVar23 + 1;
                    uVar24 = uVar24 + 1;
                    uVar7 = uVar7 + uVar22;
                  } while (uVar24 != uVar19);
                  local_15c = local_15c + 1;
                } while (local_15c != (int)local_140);
                mip_level::assign(local_100,local_130,local_148->m_format,cDefaultOrientationFlags);
                uVar11 = extraout_RAX;
LAB_0012f414:
                uVar24 = local_b8 + 1;
              } while (uVar24 != local_c8);
              uVar24 = local_d0 + 1;
              local_168 = (undefined4)CONCAT71((int7)((ulong)uVar11 >> 8),local_d8 <= uVar24);
            } while (uVar24 != local_d8);
            dynamic_string::clear(local_e0);
            local_168 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
            if ((local_138 & 1) != 0) {
              change_dxt1_to_dxt1a(local_148);
            }
LAB_0012f492:
            vector<unsigned_char>::~vector((vector<unsigned_char> *)&local_158);
            bVar12 = (byte)local_168;
            goto LAB_0012e7b1;
          }
          pcVar20 = "Palettized textures unsupported";
        }
        else if ((local_40 >> 9 & 1) == 0) {
          if ((local_40 >> 0x15 & 1) == 0) goto LAB_0012e86e;
          pcVar20 = "Volume textures unsupported";
        }
        else {
          uVar19 = 6;
          if ((~local_40 & 0xfc00) == 0) goto LAB_0012e86e;
          pcVar20 = "Incomplete cubemaps unsupported";
        }
LAB_0012ed26:
        dynamic_string::set(this_00,pcVar20,0xffffffff);
      }
    }
  }
LAB_0012e7af:
  bVar12 = 0;
LAB_0012e7b1:
  return (bool)(bVar12 & 1);
}

Assistant:

bool mipmapped_texture::read_dds_internal(data_stream_serializer& serializer) {
  CRNLIB_ASSERT(serializer.get_little_endian());

  clear();

  set_last_error("Not a DDS file");

  uint8 hdr[4];
  if (!serializer.read(hdr, sizeof(hdr)))
    return false;

  if (memcmp(hdr, "DDS ", 4) != 0)
    return false;

  DDSURFACEDESC2 desc;
  if (!serializer.read(&desc, sizeof(desc)))
    return false;

  if (!c_crnlib_little_endian_platform)
    utils::endian_switch_dwords(reinterpret_cast<uint32*>(&desc), sizeof(desc) / sizeof(uint32));

  if (desc.dwSize != sizeof(desc))
    return false;

  if ((!desc.dwHeight) || (!desc.dwWidth) || (desc.dwHeight > cDDSMaxImageDimensions) || (desc.dwWidth > cDDSMaxImageDimensions))
    return false;

  m_width = desc.dwWidth;
  m_height = desc.dwHeight;

  uint num_mip_levels = 1;

  if ((desc.dwFlags & DDSD_MIPMAPCOUNT) && (desc.ddsCaps.dwCaps & DDSCAPS_MIPMAP) && (desc.dwMipMapCount)) {
    num_mip_levels = desc.dwMipMapCount;
    if (num_mip_levels > utils::compute_max_mips(desc.dwWidth, desc.dwHeight))
      return false;
  }

  uint num_faces = 1;

  if (desc.ddsCaps.dwCaps & DDSCAPS_COMPLEX) {
    if (desc.ddsCaps.dwCaps2 & DDSCAPS2_CUBEMAP) {
      const uint all_faces_mask = DDSCAPS2_CUBEMAP_POSITIVEX | DDSCAPS2_CUBEMAP_NEGATIVEX | DDSCAPS2_CUBEMAP_POSITIVEY | DDSCAPS2_CUBEMAP_NEGATIVEY | DDSCAPS2_CUBEMAP_POSITIVEZ | DDSCAPS2_CUBEMAP_NEGATIVEZ;
      if ((desc.ddsCaps.dwCaps2 & all_faces_mask) != all_faces_mask) {
        set_last_error("Incomplete cubemaps unsupported");
        return false;
      }

      num_faces = 6;
    } else if (desc.ddsCaps.dwCaps2 & DDSCAPS2_VOLUME) {
      set_last_error("Volume textures unsupported");
      return false;
    }
  }

  if (desc.ddpfPixelFormat.dwFlags & DDPF_PALETTEINDEXED8) {
    // It's difficult to even make P8 textures with existing tools:
    // nvdxt just hangs
    // dxtex.exe just makes all-white textures
    // So screw it.
    set_last_error("Palettized textures unsupported");
    return false;
  }

  dxt_format dxt_fmt = cDXTInvalid;

  if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC) {
    // http://code.google.com/p/nvidia-texture-tools/issues/detail?id=41
    // ATI2 YX:            0 (0x00000000)
    // ATI2 XY:   1498952257 (0x59583241) (BC5)
    // ATI Compressonator obeys this stuff, nvidia's tools (like readdxt) don't - oh great

    switch (desc.ddpfPixelFormat.dwFourCC) {
      case PIXEL_FMT_DXT1: {
        m_format = PIXEL_FMT_DXT1;
        dxt_fmt = cDXT1;
        break;
      }
      case PIXEL_FMT_DXT2:
      case PIXEL_FMT_DXT3: {
        m_format = PIXEL_FMT_DXT3;
        dxt_fmt = cDXT3;
        break;
      }
      case PIXEL_FMT_DXT4:
      case PIXEL_FMT_DXT5: {
        switch (desc.ddpfPixelFormat.dwRGBBitCount) {
          case PIXEL_FMT_DXT5_CCxY:
            m_format = PIXEL_FMT_DXT5_CCxY;
            break;
          case PIXEL_FMT_DXT5_xGxR:
            m_format = PIXEL_FMT_DXT5_xGxR;
            break;
          case PIXEL_FMT_DXT5_xGBR:
            m_format = PIXEL_FMT_DXT5_xGBR;
            break;
          case PIXEL_FMT_DXT5_AGBR:
            m_format = PIXEL_FMT_DXT5_AGBR;
            break;
          default:
            m_format = PIXEL_FMT_DXT5;
            break;
        }

        dxt_fmt = cDXT5;
        break;
      }
      case PIXEL_FMT_3DC: {
        if (desc.ddpfPixelFormat.dwRGBBitCount == CRNLIB_PIXEL_FMT_FOURCC('A', '2', 'X', 'Y')) {
          dxt_fmt = cDXN_XY;
          m_format = PIXEL_FMT_DXN;
        } else {
          dxt_fmt = cDXN_YX;  // aka ATI2
          m_format = PIXEL_FMT_3DC;
        }

        break;
      }
      case PIXEL_FMT_DXT5A: {
        m_format = PIXEL_FMT_DXT5A;
        dxt_fmt = cDXT5A;
        break;
      }
      case PIXEL_FMT_ETC1: {
        m_format = PIXEL_FMT_ETC1;
        dxt_fmt = cETC1;
        break;
      }
      case PIXEL_FMT_ETC2: {
        m_format = PIXEL_FMT_ETC2;
        dxt_fmt = cETC2;
        break;
      }
      case PIXEL_FMT_ETC2A: {
        m_format = PIXEL_FMT_ETC2A;
        dxt_fmt = cETC2A;
        break;
      }
      case PIXEL_FMT_ETC1S: {
        m_format = PIXEL_FMT_ETC1S;
        dxt_fmt = cETC1S;
        break;
      }
      case PIXEL_FMT_ETC2AS: {
        m_format = PIXEL_FMT_ETC2AS;
        dxt_fmt = cETC2AS;
        break;
      }
      default: {
        dynamic_string err_msg(cVarArg, "Unsupported DDS FOURCC format: 0x%08X", desc.ddpfPixelFormat.dwFourCC);
        set_last_error(err_msg.get_ptr());
        return false;
      }
    }
  } else if ((desc.ddpfPixelFormat.dwRGBBitCount < 8) || (desc.ddpfPixelFormat.dwRGBBitCount > 32) || (desc.ddpfPixelFormat.dwRGBBitCount & 7)) {
    set_last_error("Unsupported bit count");
    return false;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_RGB) {
    if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) {
      if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS)
        m_format = PIXEL_FMT_A8L8;
      else
        m_format = PIXEL_FMT_L8;
    } else if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS)
      m_format = PIXEL_FMT_A8R8G8B8;
    else
      m_format = PIXEL_FMT_R8G8B8;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS) {
    if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE)
      m_format = PIXEL_FMT_A8L8;
    else
      m_format = PIXEL_FMT_A8;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) {
    m_format = PIXEL_FMT_L8;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHA) {
    m_format = PIXEL_FMT_A8;
  } else {
    set_last_error("Unsupported format");
    return false;
  }

  m_comp_flags = pixel_format_helpers::get_component_flags(m_format);

  uint bits_per_pixel = desc.ddpfPixelFormat.dwRGBBitCount;

  if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC)
    bits_per_pixel = pixel_format_helpers::get_bpp(m_format);

  set_last_error("Load failed");

  uint default_pitch;
  if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC)
    default_pitch = (((desc.dwWidth + 3) & ~3) * ((desc.dwHeight + 3) & ~3) * bits_per_pixel) >> 3;
  else
    default_pitch = (desc.dwWidth * bits_per_pixel) >> 3;

  uint pitch = 0;
  if ((desc.dwFlags & DDSD_PITCH) && (!(desc.dwFlags & DDSD_LINEARSIZE))) {
    pitch = desc.lPitch;
  }

  if (!pitch)
    pitch = default_pitch;
#if 0
      else if (pitch & 3)
      {
         // MS's DDS docs say the pitch must be DWORD aligned - but this isn't always the case.
         // ATI Compressonator writes images with non-DWORD aligned pitches, and the DDSWithoutD3DX sample from MS doesn't compute the proper DWORD aligned pitch when reading DDS
         // files, so the docs must be wrong/outdated.
         console::warning("DDS file's pitch is not divisible by 4 - trying to load anyway.");
      }
#endif
  // Check for obviously wacky source pitches (probably a corrupted/invalid file).
  else if (pitch > default_pitch * 8) {
    set_last_error("Invalid pitch");
    return false;
  }

  crnlib::vector<uint8> load_buf;

  uint mask_size[4];
  mask_size[0] = math::bitmask_size(desc.ddpfPixelFormat.dwRBitMask);
  mask_size[1] = math::bitmask_size(desc.ddpfPixelFormat.dwGBitMask);
  mask_size[2] = math::bitmask_size(desc.ddpfPixelFormat.dwBBitMask);
  mask_size[3] = math::bitmask_size(desc.ddpfPixelFormat.dwRGBAlphaBitMask);

  uint mask_ofs[4];
  mask_ofs[0] = math::bitmask_ofs(desc.ddpfPixelFormat.dwRBitMask);
  mask_ofs[1] = math::bitmask_ofs(desc.ddpfPixelFormat.dwGBitMask);
  mask_ofs[2] = math::bitmask_ofs(desc.ddpfPixelFormat.dwBBitMask);
  mask_ofs[3] = math::bitmask_ofs(desc.ddpfPixelFormat.dwRGBAlphaBitMask);

  if ((desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) && (!mask_size[0])) {
    mask_size[0] = desc.ddpfPixelFormat.dwRGBBitCount >> 3;
    if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS)
      mask_size[0] /= 2;
  }

  m_faces.resize(num_faces);

  bool dxt1_alpha = false;

  for (uint face_index = 0; face_index < num_faces; face_index++) {
    m_faces[face_index].resize(num_mip_levels);

    for (uint level_index = 0; level_index < num_mip_levels; level_index++) {
      const uint width = math::maximum<uint>(desc.dwWidth >> level_index, 1U);
      const uint height = math::maximum<uint>(desc.dwHeight >> level_index, 1U);

      mip_level* pMip = crnlib_new<mip_level>();
      m_faces[face_index][level_index] = pMip;

      if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC) {
        const uint bytes_per_block = pixel_format_helpers::get_dxt_bytes_per_block(m_format);

        const uint num_blocks_x = (width + 3) >> 2;
        const uint num_blocks_y = (height + 3) >> 2;

        const uint actual_level_pitch = num_blocks_x * num_blocks_y * bytes_per_block;
        const uint level_pitch = level_index ? actual_level_pitch : pitch;

        dxt_image* pDXTImage = crnlib_new<dxt_image>();
        if (!pDXTImage->init(dxt_fmt, width, height, false)) {
          crnlib_delete(pDXTImage);

          CRNLIB_ASSERT(0);
          return false;
        }

        CRNLIB_ASSERT(pDXTImage->get_element_vec().size() * sizeof(dxt_image::element) == actual_level_pitch);

        if (!serializer.read(&pDXTImage->get_element_vec()[0], actual_level_pitch)) {
          crnlib_delete(pDXTImage);

          return false;
        }

        // DDS image in memory are always assumed to be little endian - the same as DDS itself.
        //if (c_crnlib_big_endian_platform)
        //   utils::endian_switch_words(reinterpret_cast<uint16*>(&pDXTImage->get_element_vec()[0]), actual_level_pitch / sizeof(uint16));

        if (level_pitch > actual_level_pitch) {
          if (!serializer.skip(level_pitch - actual_level_pitch)) {
            crnlib_delete(pDXTImage);

            return false;
          }
        }

        if ((m_format == PIXEL_FMT_DXT1) && (!dxt1_alpha))
          dxt1_alpha = pDXTImage->has_alpha();

        pMip->assign(pDXTImage, m_format);
      } else {
        image_u8* pImage = crnlib_new<image_u8>(width, height);

        pImage->set_comp_flags(m_comp_flags);

        const uint bytes_per_pixel = desc.ddpfPixelFormat.dwRGBBitCount >> 3;
        const uint actual_line_pitch = width * bytes_per_pixel;
        const uint line_pitch = level_index ? actual_line_pitch : pitch;

        if (load_buf.size() < line_pitch)
          load_buf.resize(line_pitch);

        color_quad_u8 q(0, 0, 0, 255);

        for (uint y = 0; y < height; y++) {
          if (!serializer.read(&load_buf[0], line_pitch)) {
            crnlib_delete(pImage);
            return false;
          }

          color_quad_u8* pDst = pImage->get_scanline(y);

          for (uint x = 0; x < width; x++) {
            const uint8* pPixel = &load_buf[x * bytes_per_pixel];

            uint c = 0;
            // Assumes DDS is always little endian.
            for (uint l = 0; l < bytes_per_pixel; l++)
              c |= (pPixel[l] << (l * 8U));

            for (uint i = 0; i < 4; i++) {
              if (!mask_size[i])
                continue;

              uint mask = (1U << mask_size[i]) - 1U;
              uint bits = (c >> mask_ofs[i]) & mask;

              uint v = (bits * 255 + (mask >> 1)) / mask;

              q.set_component(i, v);
            }

            if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) {
              q.g = q.r;
              q.b = q.r;
            }

            *pDst++ = q;
          }
        }

        pMip->assign(pImage, m_format);

        CRNLIB_ASSERT(pMip->get_comp_flags() == m_comp_flags);
      }
    }
  }

  clear_last_error();

  if (dxt1_alpha)
    change_dxt1_to_dxt1a();

  return true;
}